

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NULL.c
# Opt level: O2

asn_enc_rval_t *
NULL_encode_xer(asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,void *sptr,
               int ilevel,xer_encoder_flags_e flags,asn_app_consume_bytes_f *cb,void *app_key)

{
  __return_storage_ptr__->encoded = 0;
  __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
  __return_storage_ptr__->structure_ptr = (void *)0x0;
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
NULL_encode_xer(asn_TYPE_descriptor_t *td, void *sptr,
	int ilevel, enum xer_encoder_flags_e flags,
		asn_app_consume_bytes_f *cb, void *app_key) {
	asn_enc_rval_t er;

	(void)td;
	(void)sptr;
	(void)ilevel;
	(void)flags;
	(void)cb;
	(void)app_key;

	/* XMLNullValue is empty */
	er.encoded = 0;
	ASN__ENCODED_OK(er);
}